

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void * my_numbox_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_my_numbox *x_00;
  _glist *p_Var2;
  _clock *p_Var3;
  t_float tVar4;
  int local_ac;
  undefined1 local_98 [8];
  t_iemgui_drawfunctions w_1;
  double v;
  double max;
  double min;
  int local_40;
  int log_height;
  int fs;
  int ldy;
  int ldx;
  int lilo;
  int h;
  int w;
  t_my_numbox *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  x_00 = (t_my_numbox *)iemgui_new(my_numbox_class);
  lilo = 5;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldx = (int)((double)((iVar1 + 5) * 0xe) / 15.0);
  ldy = 0;
  fs = 0;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  log_height = (int)((double)((iVar1 + 5) * -8) / 15.0);
  local_40 = (x_00->x_gui).x_fontsize;
  min._4_4_ = 0x100;
  max = -1e+37;
  v = 1e+37;
  w_1.draw_move = (t_iemdrawfunptr)0x0;
  local_98 = (undefined1  [8])my_numbox_draw_new;
  w_1.draw_new = my_numbox_draw_config;
  w_1.draw_config = (t_iemdrawfunptr)0x0;
  w_1.draw_iolets = my_numbox_draw_update;
  w_1.draw_update = my_numbox_draw_select;
  w_1.draw_select = (t_iemdrawfunptr)0x0;
  w_1.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x_00,(t_iemgui_drawfunctions *)local_98);
  if ((((((argc < 0x11) || (argv->a_type != A_FLOAT)) || (argv[1].a_type != A_FLOAT)) ||
       ((argv[2].a_type != A_FLOAT || (argv[3].a_type != A_FLOAT)))) ||
      (((argv[4].a_type != A_FLOAT || (argv[5].a_type != A_FLOAT)) ||
       ((argv[6].a_type != A_SYMBOL && (argv[6].a_type != A_FLOAT)))))) ||
     (((argv[7].a_type != A_SYMBOL && (argv[7].a_type != A_FLOAT)) ||
      ((((argv[8].a_type != A_SYMBOL && (argv[8].a_type != A_FLOAT)) || (argv[9].a_type != A_FLOAT))
       || (((argv[10].a_type != A_FLOAT || (argv[0xb].a_type != A_FLOAT)) ||
           ((argv[0xc].a_type != A_FLOAT || (argv[0x10].a_type != A_FLOAT)))))))))) {
    iemgui_new_getnames((t_iemgui *)x_00,6,(t_atom *)0x0);
  }
  else {
    tVar4 = atom_getfloatarg(0,argc,argv);
    lilo = (int)tVar4;
    tVar4 = atom_getfloatarg(1,argc,argv);
    ldx = (int)tVar4;
    tVar4 = atom_getfloatarg(2,argc,argv);
    max = (double)tVar4;
    tVar4 = atom_getfloatarg(3,argc,argv);
    v = (double)tVar4;
    tVar4 = atom_getfloatarg(4,argc,argv);
    ldy = (int)tVar4;
    tVar4 = atom_getfloatarg(5,argc,argv);
    iem_inttosymargs(&(x_00->x_gui).x_isa,(int)tVar4);
    iemgui_new_getnames((t_iemgui *)x_00,6,argv);
    tVar4 = atom_getfloatarg(9,argc,argv);
    fs = (int)tVar4;
    tVar4 = atom_getfloatarg(10,argc,argv);
    log_height = (int)tVar4;
    tVar4 = atom_getfloatarg(0xb,argc,argv);
    iem_inttofstyle(&(x_00->x_gui).x_fsf,(int)tVar4);
    tVar4 = atom_getfloatarg(0xc,argc,argv);
    local_40 = (int)tVar4;
    iemgui_all_loadcolors((t_iemgui *)x_00,argv + 0xd,argv + 0xe,argv + 0xf);
    tVar4 = atom_getfloatarg(0x10,argc,argv);
    w_1.draw_move = (t_iemdrawfunptr)(double)tVar4;
  }
  if ((argc == 0x12) && (argv[0x11].a_type == A_FLOAT)) {
    tVar4 = atom_getfloatarg(0x11,0x12,argv);
    min._4_4_ = (int)tVar4;
  }
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffff7f | (uint)((x_00->x_gui).x_snd != (t_symbol *)0x0) << 7
       );
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffffbf | (uint)((x_00->x_gui).x_rcv != (t_symbol *)0x0) << 6
       );
  if (((uint)(x_00->x_gui).x_isa & 1) == 0) {
    x_00->x_val = 0.0;
  }
  else {
    x_00->x_val = (float)(double)w_1.draw_move;
  }
  if (ldy != 0) {
    ldy = 1;
  }
  x_00->x_lin0_log1 = ldy;
  if (min._4_4_ < 10) {
    min._4_4_ = 10;
  }
  x_00->x_log_height = min._4_4_;
  if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 1) {
    strcpy((x_00->x_gui).x_font,"helvetica");
  }
  else if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 2) {
    strcpy((x_00->x_gui).x_font,"times");
  }
  else {
    (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xffffffc0);
    strcpy((x_00->x_gui).x_font,sys_font);
  }
  if (((uint)(x_00->x_gui).x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)x_00,(x_00->x_gui).x_rcv);
  }
  (x_00->x_gui).x_ldx = fs;
  (x_00->x_gui).x_ldy = log_height;
  if (local_40 < 4) {
    local_ac = 4;
  }
  else {
    local_ac = local_40;
  }
  (x_00->x_gui).x_fontsize = local_ac;
  if (lilo < 1) {
    lilo = 1;
  }
  x_00->x_numwidth = lilo;
  if (ldx < 8) {
    ldx = 8;
  }
  (x_00->x_gui).x_h = ldx;
  x_00->x_buf[0] = '\0';
  my_numbox_check_minmax(x_00,max,v);
  iemgui_verify_snd_ne_rcv((t_iemgui *)x_00);
  p_Var3 = clock_new(x_00,my_numbox_tick_wait);
  x_00->x_clock_wait = p_Var3;
  (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xf7ffffff);
  iemgui_newzoom((t_iemgui *)x_00);
  my_numbox_calc_fontwidth(x_00);
  outlet_new((t_object *)x_00,&s_float);
  return x_00;
}

Assistant:

static void *my_numbox_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_numbox *x = (t_my_numbox *)iemgui_new(my_numbox_class);
    int w = 5, h = 14 * IEM_GUI_DEFAULTSIZE_SCALE;
    int lilo = 0, ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    int log_height = 256;
    double min = -1.0e+37, max = 1.0e+37, v = 0.0;

    IEMGUI_SETDRAWFUNCTIONS(x, my_numbox);

    if((argc >= 17)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&IS_A_FLOAT(argv,2)&&IS_A_FLOAT(argv,3)
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&(IS_A_SYMBOL(argv,7)||IS_A_FLOAT(argv,7))
       &&(IS_A_SYMBOL(argv,8)||IS_A_FLOAT(argv,8))
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)
       &&IS_A_FLOAT(argv,11)&&IS_A_FLOAT(argv,12)&&IS_A_FLOAT(argv,16))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        min = (double)atom_getfloatarg(2, argc, argv);
        max = (double)atom_getfloatarg(3, argc, argv);
        lilo = (int)atom_getfloatarg(4, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(5, argc, argv));
        iemgui_new_getnames(&x->x_gui, 6, argv);
        ldx = (int)atom_getfloatarg(9, argc, argv);
        ldy = (int)atom_getfloatarg(10, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(11, argc, argv));
        fs = (int)atom_getfloatarg(12, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+13, argv+14, argv+15);
        v = atom_getfloatarg(16, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 6, 0);
    if((argc == 18)&&IS_A_FLOAT(argv,17))
    {
        log_height = (int)atom_getfloatarg(17, argc, argv);
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_isa.x_loadinit)
        x->x_val = v;
    else
        x->x_val = 0.0;
    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    if(log_height < 10)
        log_height = 10;
    x->x_log_height = log_height;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < MINFONT)?MINFONT:fs;
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(h < IEM_GUI_MINSIZE)
        h = IEM_GUI_MINSIZE;
    x->x_gui.x_h = h;
    x->x_buf[0] = 0;
    my_numbox_check_minmax(x, min, max);
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    x->x_clock_wait = clock_new(x, (t_method)my_numbox_tick_wait);
    x->x_gui.x_fsf.x_change = 0;
    iemgui_newzoom(&x->x_gui);
    my_numbox_calc_fontwidth(x);
    outlet_new(&x->x_gui.x_obj, &s_float);
    return (x);
}